

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O3

void R_DrawSpanMaskedTranslucentP_C(void)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  BYTE *pBVar4;
  DWORD *pDVar5;
  DWORD *pDVar6;
  lighttable_t *plVar7;
  dsfixed_t dVar8;
  dsfixed_t dVar9;
  BYTE *pBVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  dsfixed_t dVar14;
  dsfixed_t dVar15;
  uint uVar16;
  int iVar17;
  
  pBVar10 = ds_source;
  dVar9 = ds_ystep;
  dVar8 = ds_xstep;
  plVar7 = ds_colormap;
  pDVar6 = dc_destblend;
  pDVar5 = dc_srcblend;
  pBVar4 = dc_destorg;
  iVar11 = ylookup[ds_y] + ds_x1;
  iVar17 = (ds_x2 - ds_x1) + 1;
  if (ds_ybits == 6 && ds_xbits == 6) {
    lVar12 = 0;
    dVar14 = ds_xfrac;
    dVar15 = ds_yfrac;
    do {
      uVar13 = (ulong)pBVar10[dVar15 >> 0x1a | dVar14 >> 0x14 & 0xffffffc0];
      if (uVar13 != 0) {
        uVar16 = pDVar6[pBVar4[lVar12 + iVar11]] + pDVar5[plVar7[uVar13]] | 0x1f07c1f;
        pBVar4[lVar12 + iVar11] = RGB32k.All[uVar16 >> 0xf & uVar16];
      }
      dVar14 = dVar14 + dVar8;
      dVar15 = dVar15 + dVar9;
      lVar12 = lVar12 + 1;
    } while (iVar17 != (int)lVar12);
  }
  else {
    bVar3 = (byte)ds_ybits;
    bVar2 = 0x20 - bVar3;
    bVar1 = (byte)ds_xbits;
    lVar12 = 0;
    dVar14 = ds_xfrac;
    dVar15 = ds_yfrac;
    do {
      uVar13 = (ulong)pBVar10[(int)((dVar15 >> (bVar2 & 0x1f)) +
                                   (dVar14 >> (bVar2 - bVar1 & 0x1f) &
                                   ~(-1 << (bVar1 & 0x1f)) << (bVar3 & 0x1f)))];
      if (uVar13 != 0) {
        uVar16 = pDVar6[pBVar4[lVar12 + iVar11]] + pDVar5[plVar7[uVar13]] | 0x1f07c1f;
        pBVar4[lVar12 + iVar11] = RGB32k.All[uVar16 >> 0xf & uVar16];
      }
      dVar14 = dVar14 + dVar8;
      dVar15 = dVar15 + dVar9;
      lVar12 = lVar12 + 1;
    } while (iVar17 != (int)lVar12);
  }
  return;
}

Assistant:

void R_DrawSpanMaskedTranslucentP_C (void)
{
	dsfixed_t			xfrac;
	dsfixed_t			yfrac;
	dsfixed_t			xstep;
	dsfixed_t			ystep;
	BYTE*				dest;
	const BYTE*			source = ds_source;
	const BYTE*			colormap = ds_colormap;
	int 				count;
	int 				spot;
	DWORD *fg2rgb = dc_srcblend;
	DWORD *bg2rgb = dc_destblend;

	xfrac = ds_xfrac;
	yfrac = ds_yfrac;

	dest = ylookup[ds_y] + ds_x1 + dc_destorg;

	count = ds_x2 - ds_x1 + 1;

	xstep = ds_xstep;
	ystep = ds_ystep;

	if (ds_xbits == 6 && ds_ybits == 6)
	{
		// 64x64 is the most common case by far, so special case it.
		do
		{
			BYTE texdata;

			spot = ((xfrac>>(32-6-6))&(63*64)) + (yfrac>>(32-6));
			texdata = source[spot];
			if (texdata != 0)
			{
				DWORD fg = colormap[texdata];
				DWORD bg = *dest;
				fg = fg2rgb[fg];
				bg = bg2rgb[bg];
				fg = (fg+bg) | 0x1f07c1f;
				*dest = RGB32k.All[fg & (fg>>15)];
			}
			dest++;
			xfrac += xstep;
			yfrac += ystep;
		} while (--count);
	}
	else
	{
		BYTE yshift = 32 - ds_ybits;
		BYTE xshift = yshift - ds_xbits;
		int xmask = ((1 << ds_xbits) - 1) << ds_ybits;
		do
		{
			BYTE texdata;
		
			spot = ((xfrac >> xshift) & xmask) + (yfrac >> yshift);
			texdata = source[spot];
			if (texdata != 0)
			{
				DWORD fg = colormap[texdata];
				DWORD bg = *dest;
				fg = fg2rgb[fg];
				bg = bg2rgb[bg];
				fg = (fg+bg) | 0x1f07c1f;
				*dest = RGB32k.All[fg & (fg>>15)];
			}
			dest++;
			xfrac += xstep;
			yfrac += ystep;
		} while (--count);
	}
}